

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::ReplaySnapshotEvent(EventLog *this)

{
  int iVar1;
  EventLogEntry *pEVar2;
  Recycler *this_00;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  ScriptContext **ppSVar4;
  SnapshotEventLogEntry *pSVar5;
  undefined1 local_550 [8];
  TTDCompareMap compareMap;
  SnapShot *recordedSnap;
  SnapshotEventLogEntry *recordedSnapEntry;
  EventLogEntry *evt;
  undefined1 local_78 [4];
  int32 i;
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  liveTopLevelBodies;
  SnapshotEventLogEntry *snapUpdateEvt;
  EventLogEntry *revt;
  AutoNestedHandledExceptionType local_1c;
  SnapShot *pSStack_18;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  SnapShot *snap;
  EventLog *this_local;
  
  pSStack_18 = (SnapShot *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_1c,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  liveTopLevelBodies.
  super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)NSLogEvents::
                 GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                           (pEVar2);
  ThreadContextTTD::SyncCtxtsAndRootsWithSnapshot_Replay
            (this->m_threadContext->TTDContext,
             (liveTopLevelBodies.
              super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats)->countOfEmptyBuckets,
             *(TTD_LOG_PTR_ID **)
              &(liveTopLevelBodies.
                super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .stats)->itemCount,
             (liveTopLevelBodies.
              super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats)->lookupCount,
             *(TTD_LOG_PTR_ID **)
              &(liveTopLevelBodies.
                super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .stats)->lookupDepthTotal);
  this_00 = ThreadContext::GetRecycler(this->m_threadContext);
  Memory::Recycler::CollectNow<(Memory::CollectionFlags)16384>(this_00);
  SnapshotExtractor::DoResetWeakCollectionPinSet(&this->m_snapExtractor,this->m_threadContext);
  SetSnapshotOrInflateInProgress(this,true);
  PushMode(this,ExcludedExecutionTTAction);
  JsUtil::
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet((BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)local_78,&Memory::HeapAllocator::Instance,0);
  pSStack_18 = DoSnapshotExtract_Helper
                         (this,0.0,(BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                    *)local_78);
  evt._4_4_ = 0;
  while( true ) {
    pLVar3 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
    iVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&pLVar3->
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar1 <= evt._4_4_) break;
    pLVar3 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
    ppSVar4 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(pLVar3,evt._4_4_);
    ScriptContextTTD::CleanUnreachableTopLevelBodies
              ((*ppSVar4)->TTDContextInfo,
               (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)local_78);
    evt._4_4_ = evt._4_4_ + 1;
  }
  pEVar2 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  NSLogEvents::SnapshotEventLogEntry_EnsureSnapshotDeserialized(pEVar2,this->m_threadContext);
  pSVar5 = NSLogEvents::
           GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (pEVar2);
  compareMap.H2PendingAsyncModBufferSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)pSVar5->Snap;
  TTDCompareMap::TTDCompareMap((TTDCompareMap *)local_550,this->m_threadContext);
  SnapShot::InitializeForSnapshotCompare
            ((SnapShot *)
             compareMap.H2PendingAsyncModBufferSet.
             super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats,pSStack_18,(TTDCompareMap *)local_550);
  SnapShot::DoSnapshotCompare
            ((SnapShot *)
             compareMap.H2PendingAsyncModBufferSet.
             super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats,pSStack_18,(TTDCompareMap *)local_550);
  Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::SnapShot>
            (&Memory::HeapAllocator::Instance,pSStack_18);
  PopMode(this,ExcludedExecutionTTAction);
  SetSnapshotOrInflateInProgress(this,false);
  TTDCompareMap::~TTDCompareMap((TTDCompareMap *)local_550);
  JsUtil::
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseHashSet((BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)local_78);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_1c);
  AdvanceTimeAndPositionForReplay(this);
  return;
}

Assistant:

void EventLog::ReplaySnapshotEvent()
    {
        SnapShot* snap = nullptr;
        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));

            //clear the weak collection pin set and force a GC (to get weak containers in a consistent state)
            NSLogEvents::EventLogEntry* revt = this->m_currentReplayEventIterator.Current();
            NSLogEvents::SnapshotEventLogEntry* snapUpdateEvt = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(revt);

            this->m_threadContext->TTDContext->SyncCtxtsAndRootsWithSnapshot_Replay(snapUpdateEvt->LiveContextCount, snapUpdateEvt->LiveContextIdArray, snapUpdateEvt->LongLivedRefRootsCount, snapUpdateEvt->LongLivedRefRootsIdArray);
            this->m_threadContext->GetRecycler()->CollectNow<CollectNowForceInThread>();

            //need to do a visit of some sort to reset the weak collection pin set
            this->m_snapExtractor.DoResetWeakCollectionPinSet(this->m_threadContext);

            //We always need to cleanup references (above but only do compare in extra diagnostics mode)
#if ENABLE_SNAPSHOT_COMPARE
            this->SetSnapshotOrInflateInProgress(true);
            this->PushMode(TTDMode::ExcludedExecutionTTAction);

            JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator> liveTopLevelBodies(&HeapAllocator::Instance);
            snap = this->DoSnapshotExtract_Helper(0.0, liveTopLevelBodies);

            for(int32 i = 0; i < this->m_threadContext->TTDContext->GetTTDContexts().Count(); ++i)
            {
                this->m_threadContext->TTDContext->GetTTDContexts().Item(i)->TTDContextInfo->CleanUnreachableTopLevelBodies(liveTopLevelBodies);
            }

            NSLogEvents::EventLogEntry* evt = this->m_currentReplayEventIterator.Current();
            NSLogEvents::SnapshotEventLogEntry_EnsureSnapshotDeserialized(evt, this->m_threadContext);

            const NSLogEvents::SnapshotEventLogEntry* recordedSnapEntry = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(evt);
            const SnapShot* recordedSnap = recordedSnapEntry->Snap;

            TTDCompareMap compareMap(this->m_threadContext);
            SnapShot::InitializeForSnapshotCompare(recordedSnap, snap, compareMap);
            SnapShot::DoSnapshotCompare(recordedSnap, snap, compareMap);

            TT_HEAP_DELETE(SnapShot, snap);

            this->PopMode(TTDMode::ExcludedExecutionTTAction);
            this->SetSnapshotOrInflateInProgress(false);
#endif
        }
        catch(...)
        {
            if(snap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, snap);
            }
            TTDAssert(false, "OOM in snapshot replay...");
        }

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteLiteralMsg("---SNAPSHOT EVENT---\n");
#endif

        this->AdvanceTimeAndPositionForReplay(); //move along
    }